

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

void google::GetAllFlags(vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                         *OUTPUT)

{
  Mutex *pMVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  pointer pCVar5;
  pointer pCVar6;
  long lVar7;
  FlagRegistry *pFVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  _Rb_tree_header *p_Var11;
  CommandLineFlagInfo fi;
  CommandLineFlagInfo local_100;
  
  pFVar8 = anon_unknown_1::FlagRegistry::GlobalRegistry();
  iVar4 = (pFVar8->lock_).mutex_;
  (pFVar8->lock_).mutex_ = iVar4 + -1;
  if (iVar4 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  p_Var9 = (pFVar8->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(pFVar8->flags_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 == p_Var11) {
    (pFVar8->lock_).mutex_ = 0;
  }
  else {
    paVar2 = &local_100.default_value.field_2;
    paVar3 = &local_100.filename.field_2;
    do {
      local_100.name._M_dataplus._M_p = (pointer)&local_100.name.field_2;
      local_100.name._M_string_length = 0;
      local_100.name.field_2._M_local_buf[0] = '\0';
      local_100.type._M_dataplus._M_p = (pointer)&local_100.type.field_2;
      local_100.type._M_string_length = 0;
      local_100.type.field_2._M_local_buf[0] = '\0';
      local_100.description._M_dataplus._M_p = (pointer)&local_100.description.field_2;
      local_100.description._M_string_length = 0;
      local_100.description.field_2._M_local_buf[0] = '\0';
      local_100.current_value._M_dataplus._M_p = (pointer)&local_100.current_value.field_2;
      local_100.current_value._M_string_length = 0;
      local_100.current_value.field_2._M_local_buf[0] = '\0';
      local_100.default_value._M_string_length = 0;
      local_100.default_value.field_2._M_local_buf[0] = '\0';
      local_100.filename._M_string_length = 0;
      local_100.filename.field_2._M_local_buf[0] = '\0';
      local_100.default_value._M_dataplus._M_p = (pointer)paVar2;
      local_100.filename._M_dataplus._M_p = (pointer)paVar3;
      anon_unknown_1::CommandLineFlag::FillCommandLineFlagInfo
                ((CommandLineFlag *)p_Var9[1]._M_parent,&local_100);
      std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::
      push_back(OUTPUT,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.filename._M_dataplus._M_p != paVar3) {
        operator_delete(local_100.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.default_value._M_dataplus._M_p != paVar2) {
        operator_delete(local_100.default_value._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.current_value._M_dataplus._M_p != &local_100.current_value.field_2) {
        operator_delete(local_100.current_value._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.description._M_dataplus._M_p != &local_100.description.field_2) {
        operator_delete(local_100.description._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.type._M_dataplus._M_p != &local_100.type.field_2) {
        operator_delete(local_100.type._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.name._M_dataplus._M_p != &local_100.name.field_2) {
        operator_delete(local_100.name._M_dataplus._M_p);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var11);
    pMVar1 = &pFVar8->lock_;
    pMVar1->mutex_ = pMVar1->mutex_ + 1;
    if (pMVar1->mutex_ != 0) {
      __assert_fail("mutex_++ == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                    ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
    }
  }
  pCVar5 = (OUTPUT->
           super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar6 = (OUTPUT->
           super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar5 != pCVar6) {
    uVar10 = ((long)pCVar6 - (long)pCVar5 >> 4) * 0x4ec4ec4ec4ec4ec5;
    lVar7 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::CommandLineFlagInfo*,std::vector<google::CommandLineFlagInfo,std::allocator<google::CommandLineFlagInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::FilenameFlagnameCmp>>
              (pCVar5,pCVar6,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<google::CommandLineFlagInfo*,std::vector<google::CommandLineFlagInfo,std::allocator<google::CommandLineFlagInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::FilenameFlagnameCmp>>
              (pCVar5,pCVar6);
  }
  return;
}

Assistant:

void GetAllFlags(vector<CommandLineFlagInfo>* OUTPUT) {
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  registry->Lock();
  for (FlagRegistry::FlagConstIterator i = registry->flags_.begin();
       i != registry->flags_.end(); ++i) {
    CommandLineFlagInfo fi;
    i->second->FillCommandLineFlagInfo(&fi);
    OUTPUT->push_back(fi);
  }
  registry->Unlock();
  // Now sort the flags, first by filename they occur in, then alphabetically
  sort(OUTPUT->begin(), OUTPUT->end(), FilenameFlagnameCmp());
}